

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_abstract.c
# Opt level: O0

TA_RetCode TA_ParamHolderAlloc(TA_FuncHandle *handle,TA_ParamHolder **allocatedParams)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  long *__s;
  void *__s_00;
  void *__s_01;
  undefined8 *in_RSI;
  int *in_RDI;
  TA_OutputParameterInfo **outputInfo;
  TA_OptInputParameterInfo **optInputInfo;
  TA_InputParameterInfo **inputInfo;
  TA_ParamHolderPriv *newParamsPriv;
  TA_ParamHolder *newParams;
  TA_FuncInfo *funcInfo;
  TA_ParamHolderOutput *output;
  TA_ParamHolderOptInput *optInput;
  TA_ParamHolderInput *input;
  uint i;
  uint allocSize;
  TA_FuncDef *funcDef;
  TA_ParamHolder *paramsToFree;
  void *local_38;
  uint local_28;
  TA_RetCode local_4;
  
  if ((in_RDI == (int *)0x0) || (in_RSI == (undefined8 *)0x0)) {
    local_4 = TA_BAD_PARAM;
  }
  else if (*in_RDI == -0x5dfe4dff) {
    pvVar1 = *(void **)(in_RDI + 2);
    if (pvVar1 == (void *)0x0) {
      local_4 = TA_INVALID_HANDLE;
    }
    else {
      __s = (long *)malloc(0x38);
      if (__s == (long *)0x0) {
        *in_RSI = 0;
        local_4 = TA_ALLOC_ERR;
      }
      else {
        memset(__s,0,0x38);
        paramsToFree = (TA_ParamHolder *)(__s + 1);
        *(undefined4 *)&paramsToFree->hiddenData = 0xa202b202;
        *__s = (long)paramsToFree;
        if (*(int *)((long)pvVar1 + 0x24) == 0) {
          local_4 = TA_INTERNAL_ERROR|TA_BAD_PARAM;
        }
        else {
          uVar5 = *(int *)((long)pvVar1 + 0x24) * 0x38;
          __s_00 = malloc((ulong)uVar5);
          if (__s_00 == (void *)0x0) {
            TA_ParamHolderFree(paramsToFree);
            *in_RSI = 0;
            local_4 = TA_ALLOC_ERR;
          }
          else {
            memset(__s_00,0,(ulong)uVar5);
            paramsToFree[1].hiddenData = __s_00;
            if (*(int *)((long)pvVar1 + 0x28) == 0) {
              local_38 = (void *)0x0;
            }
            else {
              uVar5 = *(int *)((long)pvVar1 + 0x28) << 4;
              local_38 = malloc((ulong)uVar5);
              if (local_38 == (void *)0x0) {
                TA_ParamHolderFree(paramsToFree);
                *in_RSI = 0;
                return TA_ALLOC_ERR;
              }
              memset(local_38,0,(ulong)uVar5);
            }
            paramsToFree[2].hiddenData = local_38;
            uVar5 = *(int *)((long)pvVar1 + 0x2c) << 4;
            __s_01 = malloc((ulong)uVar5);
            if (__s_01 == (void *)0x0) {
              TA_ParamHolderFree(paramsToFree);
              *in_RSI = 0;
              local_4 = TA_ALLOC_ERR;
            }
            else {
              memset(__s_01,0,(ulong)uVar5);
              paramsToFree[3].hiddenData = __s_01;
              paramsToFree[5].hiddenData = pvVar1;
              lVar2 = *(long *)(in_RDI + 4);
              lVar3 = *(long *)(in_RDI + 6);
              lVar4 = *(long *)(in_RDI + 8);
              for (local_28 = 0; local_28 < *(uint *)((long)pvVar1 + 0x24); local_28 = local_28 + 1)
              {
                *(undefined8 *)((long)__s_00 + (ulong)local_28 * 0x38 + 0x30) =
                     *(undefined8 *)(lVar2 + (ulong)local_28 * 8);
                *(int *)&paramsToFree[4].hiddenData = *(int *)&paramsToFree[4].hiddenData << 1;
                *(uint *)&paramsToFree[4].hiddenData = *(uint *)&paramsToFree[4].hiddenData | 1;
              }
              for (local_28 = 0; local_28 < *(uint *)((long)pvVar1 + 0x28); local_28 = local_28 + 1)
              {
                *(undefined8 *)((long)local_38 + (ulong)local_28 * 0x10 + 8) =
                     *(undefined8 *)(lVar3 + (ulong)local_28 * 8);
                if (**(int **)((long)local_38 + (ulong)local_28 * 0x10 + 8) == 0) {
                  *(undefined8 *)((long)local_38 + (ulong)local_28 * 0x10) =
                       *(undefined8 *)(*(long *)(lVar3 + (ulong)local_28 * 8) + 0x28);
                }
                else {
                  *(int *)((long)local_38 + (ulong)local_28 * 0x10) =
                       (int)*(double *)(*(long *)(lVar3 + (ulong)local_28 * 8) + 0x28);
                }
              }
              for (local_28 = 0; local_28 < *(uint *)((long)pvVar1 + 0x2c); local_28 = local_28 + 1)
              {
                *(undefined8 *)((long)__s_01 + (ulong)local_28 * 0x10 + 8) =
                     *(undefined8 *)(lVar4 + (ulong)local_28 * 8);
                *(int *)((long)&paramsToFree[4].hiddenData + 4) =
                     *(int *)((long)&paramsToFree[4].hiddenData + 4) << 1;
                *(uint *)((long)&paramsToFree[4].hiddenData + 4) =
                     *(uint *)((long)&paramsToFree[4].hiddenData + 4) | 1;
              }
              *in_RSI = __s;
              local_4 = TA_SUCCESS;
            }
          }
        }
      }
    }
  }
  else {
    *in_RSI = 0;
    local_4 = TA_INVALID_HANDLE;
  }
  return local_4;
}

Assistant:

TA_RetCode TA_ParamHolderAlloc( const TA_FuncHandle *handle,
                                TA_ParamHolder **allocatedParams )
{

   TA_FuncDef *funcDef;
   unsigned int allocSize, i;
   TA_ParamHolderInput    *input;
   TA_ParamHolderOptInput *optInput;
   TA_ParamHolderOutput   *output;

   const TA_FuncInfo *funcInfo;
   TA_ParamHolder *newParams;
   TA_ParamHolderPriv *newParamsPriv;

   const TA_InputParameterInfo    **inputInfo;
   const TA_OptInputParameterInfo **optInputInfo;
   const TA_OutputParameterInfo   **outputInfo;

   /* Validate the parameters. */
   if( !handle || !allocatedParams)
   {
      return TA_BAD_PARAM;
   }

   /* Validate that this is a valid funcHandle. */
   funcDef = (TA_FuncDef *)handle;
   if( funcDef->magicNumber != TA_FUNC_DEF_MAGIC_NB )
   {
      *allocatedParams = NULL;
      return TA_INVALID_HANDLE;
   }

   /* Get the TA_FuncInfo. */
   funcInfo = funcDef->funcInfo;
   if( !funcInfo ) return TA_INVALID_HANDLE;

   /* Allocate the TA_ParamHolder. */
   newParams = (TA_ParamHolder *)TA_Malloc( sizeof(TA_ParamHolder) + sizeof(TA_ParamHolderPriv));
   if( !newParams )
   {
      *allocatedParams = NULL;
      return TA_ALLOC_ERR;
   }

   memset( newParams, 0, sizeof(TA_ParamHolder) + sizeof(TA_ParamHolderPriv) );
   newParamsPriv = (TA_ParamHolderPriv *)(((char *)newParams)+sizeof(TA_ParamHolder));
   newParamsPriv->magicNumber = TA_PARAM_HOLDER_PRIV_MAGIC_NB;
   newParams->hiddenData = newParamsPriv;

   /* From this point, TA_ParamHolderFree can be safely called. */

   /* Allocate the array of structure holding the info
    * for each parameter.
    */
   if( funcInfo->nbInput == 0 ) return TA_INTERNAL_ERROR(2);

   allocSize = (funcInfo->nbInput) * sizeof(TA_ParamHolderInput);
   input = (TA_ParamHolderInput *)TA_Malloc( allocSize );

   if( !input )
   {
      TA_ParamHolderFree( newParams );
      *allocatedParams = NULL;
      return TA_ALLOC_ERR;
   }
   memset( input, 0, allocSize );
   newParamsPriv->in = input;

   if( funcInfo->nbOptInput == 0 )
      optInput = NULL;
   else
   {
      allocSize = (funcInfo->nbOptInput) * sizeof(TA_ParamHolderOptInput);
      optInput = (TA_ParamHolderOptInput *)TA_Malloc( allocSize );

      if( !optInput )
      {
         TA_ParamHolderFree( newParams );
         *allocatedParams = NULL;
         return TA_ALLOC_ERR;
      }
      memset( optInput, 0, allocSize );
   }
   newParamsPriv->optIn = optInput;

   allocSize = (funcInfo->nbOutput) * sizeof(TA_ParamHolderOutput);
   output = (TA_ParamHolderOutput *)TA_Malloc( allocSize );
   if( !output )
   {
      TA_ParamHolderFree( newParams );
      *allocatedParams = NULL;
      return TA_ALLOC_ERR;
   }
   memset( output, 0, allocSize );
   newParamsPriv->out = output;

   newParamsPriv->funcInfo = funcInfo;

   inputInfo    = (const TA_InputParameterInfo **)funcDef->input;
   optInputInfo = (const TA_OptInputParameterInfo **)funcDef->optInput;
   outputInfo   = (const TA_OutputParameterInfo   **)funcDef->output;

   for( i=0; i < funcInfo->nbInput; i++ )
   {
      input[i].inputInfo = inputInfo[i];
      newParamsPriv->inBitmap <<= 1;
      newParamsPriv->inBitmap |= 1;
   }

   for( i=0; i < funcInfo->nbOptInput; i++ )
   {
      optInput[i].optInputInfo = optInputInfo[i];
      if( optInput[i].optInputInfo->type == TA_OptInput_RealRange )
         optInput[i].data.optInReal = optInputInfo[i]->defaultValue;
      else
         optInput[i].data.optInInteger = (TA_Integer)optInputInfo[i]->defaultValue;
   }

   for( i=0; i < funcInfo->nbOutput; i++ )
   {
      output[i].outputInfo = outputInfo[i];
      newParamsPriv->outBitmap <<= 1;
      newParamsPriv->outBitmap |= 1;
   }

   /* Succcess, return the result to the caller. */
   *allocatedParams = newParams;

   return TA_SUCCESS;
}